

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<int> * __thiscall
kj::_::ExceptionOr<int>::operator=(ExceptionOr<int> *this,ExceptionOr<int> *param_1)

{
  ExceptionOr<int> *param_1_local;
  ExceptionOr<int> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<int>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;